

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  element_type *peVar1;
  SourceLineInfo local_98 [2];
  allocator<char> local_71;
  string local_70;
  NameAndLocation local_50;
  undefined1 local_20 [24];
  TrackerContext *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"{root}",&local_71);
  SourceLineInfo::SourceLineInfo
            (local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/cormacc[P]va_args_iterators/vendor/catch/catch.hpp"
             ,0x3826);
  NameAndLocation::NameAndLocation(&local_50,&local_70,local_98);
  std::
  make_shared<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            ((NameAndLocation *)local_20,(TrackerContext *)&local_50,(void **)this);
  std::shared_ptr<Catch::TestCaseTracking::ITracker>::operator=
            (&this->m_rootTracker,(shared_ptr<Catch::TestCaseTracking::SectionTracker> *)local_20);
  clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)local_20);
  NameAndLocation::~NameAndLocation(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  peVar1 = clara::std::
           __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  return peVar1;
}

Assistant:

ITracker& TrackerContext::startRun() {
        m_rootTracker = std::make_shared<SectionTracker>( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }